

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nonogram.cpp
# Opt level: O2

Known * __thiscall
Nonogram::get_board_vertical(Known *__return_storage_ptr__,Nonogram *this,uint x,Board *board)

{
  Known *pKVar1;
  const_reference cVar2;
  ulong *puVar3;
  ulong uVar4;
  int i;
  size_type __n;
  reference rVar5;
  vector<bool,_std::allocator<bool>_> value;
  vector<bool,_std::allocator<bool>_> set;
  allocator_type local_89;
  Known *local_88;
  _Bvector_base<std::allocator<bool>_> local_80;
  _Bvector_base<std::allocator<bool>_> local_58;
  
  local_88 = __return_storage_ptr__;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_58,(long)this->m_y,
             (allocator_type *)&local_80);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_80,(long)this->m_y,&local_89);
  for (__n = 0; pKVar1 = local_88, (long)__n < (long)this->m_y; __n = __n + 1) {
    cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((board->first).
                       super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + x,__n);
    rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)&local_58,__n);
    puVar3 = rVar5._M_p;
    if (cVar2) {
      uVar4 = rVar5._M_mask | *puVar3;
    }
    else {
      uVar4 = ~rVar5._M_mask & *puVar3;
    }
    *puVar3 = uVar4;
    cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((board->second).
                       super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + x,__n);
    rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)&local_80,__n);
    puVar3 = rVar5._M_p;
    if (cVar2) {
      uVar4 = rVar5._M_mask | *puVar3;
    }
    else {
      uVar4 = ~rVar5._M_mask & *puVar3;
    }
    *puVar3 = uVar4;
  }
  std::pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>_>::
  pair<std::vector<bool,_std::allocator<bool>_>_&,_std::vector<bool,_std::allocator<bool>_>_&,_true>
            (local_88,(vector<bool,_std::allocator<bool>_> *)&local_58,
             (vector<bool,_std::allocator<bool>_> *)&local_80);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_80);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_58);
  return pKVar1;
}

Assistant:

Known Nonogram::get_board_vertical(unsigned int x, const Board &board) const {
    vector<bool> set(m_y), value(m_y);

    for (int i = 0; i < m_y; i++) {
        set[i] = board.first[x][i];
        value[i] = board.second[x][i];
    }

    return {set, value};
}